

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_image * nifti_simple_init_nim(void)

{
  nifti_1_header nhdr_00;
  nifti_image *pnVar1;
  long lVar2;
  int *piVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined1 in_stack_fffffffffffffd28 [344];
  int local_178;
  int local_174;
  int swapsize;
  int nbyper;
  nifti_1_header nhdr;
  nifti_image *nim;
  
  bVar5 = 0;
  memset(&swapsize,0,0x15c);
  swapsize = 0x15c;
  nhdr.db_name[0x10] = 'r';
  nhdr.extents._0_2_ = 3;
  nhdr.extents._2_2_ = 1;
  nhdr.session_error = 1;
  nhdr.regular = '\x01';
  nhdr.dim_info = '\0';
  nhdr.dim[0] = 0;
  nhdr.intent_code = 0;
  nhdr.datatype = 0;
  nhdr.bitpix = 0;
  nhdr.slice_start = 0x3f80;
  nhdr.pixdim[0] = 1.0;
  nhdr.pixdim[1] = 1.0;
  nhdr.intent_p2._2_2_ = 0x10;
  nifti_datatype_sizes(0x10,&local_174,&local_178);
  nhdr.intent_p3._0_2_ = (undefined2)(local_174 << 3);
  strcpy(nhdr.intent_name + 8,"n+1");
  piVar3 = &swapsize;
  puVar4 = (undefined8 *)&stack0xfffffffffffffd28;
  for (lVar2 = 0x2b; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)piVar3;
    piVar3 = piVar3 + (ulong)bVar5 * -4 + 2;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  nhdr_00.magic[0] = nhdr.intent_name[8];
  nhdr_00.magic[1] = nhdr.intent_name[9];
  nhdr_00.magic[2] = nhdr.intent_name[10];
  nhdr_00.magic[3] = nhdr.intent_name[0xb];
  nhdr_00.sizeof_hdr = in_stack_fffffffffffffd28._0_4_;
  nhdr_00.data_type[0] = in_stack_fffffffffffffd28[4];
  nhdr_00.data_type[1] = in_stack_fffffffffffffd28[5];
  nhdr_00.data_type[2] = in_stack_fffffffffffffd28[6];
  nhdr_00.data_type[3] = in_stack_fffffffffffffd28[7];
  nhdr_00.data_type[4] = in_stack_fffffffffffffd28[8];
  nhdr_00.data_type[5] = in_stack_fffffffffffffd28[9];
  nhdr_00.data_type[6] = in_stack_fffffffffffffd28[10];
  nhdr_00.data_type[7] = in_stack_fffffffffffffd28[0xb];
  nhdr_00.data_type[8] = in_stack_fffffffffffffd28[0xc];
  nhdr_00.data_type[9] = in_stack_fffffffffffffd28[0xd];
  nhdr_00.db_name[0] = in_stack_fffffffffffffd28[0xe];
  nhdr_00.db_name[1] = in_stack_fffffffffffffd28[0xf];
  nhdr_00.db_name[2] = in_stack_fffffffffffffd28[0x10];
  nhdr_00.db_name[3] = in_stack_fffffffffffffd28[0x11];
  nhdr_00.db_name[4] = in_stack_fffffffffffffd28[0x12];
  nhdr_00.db_name[5] = in_stack_fffffffffffffd28[0x13];
  nhdr_00.db_name[6] = in_stack_fffffffffffffd28[0x14];
  nhdr_00.db_name[7] = in_stack_fffffffffffffd28[0x15];
  nhdr_00.db_name[8] = in_stack_fffffffffffffd28[0x16];
  nhdr_00.db_name[9] = in_stack_fffffffffffffd28[0x17];
  nhdr_00.db_name[10] = in_stack_fffffffffffffd28[0x18];
  nhdr_00.db_name[0xb] = in_stack_fffffffffffffd28[0x19];
  nhdr_00.db_name[0xc] = in_stack_fffffffffffffd28[0x1a];
  nhdr_00.db_name[0xd] = in_stack_fffffffffffffd28[0x1b];
  nhdr_00.db_name[0xe] = in_stack_fffffffffffffd28[0x1c];
  nhdr_00.db_name[0xf] = in_stack_fffffffffffffd28[0x1d];
  nhdr_00.db_name[0x10] = in_stack_fffffffffffffd28[0x1e];
  nhdr_00.db_name[0x11] = in_stack_fffffffffffffd28[0x1f];
  nhdr_00.extents = in_stack_fffffffffffffd28._32_4_;
  nhdr_00.session_error = in_stack_fffffffffffffd28._36_2_;
  nhdr_00.regular = in_stack_fffffffffffffd28[0x26];
  nhdr_00.dim_info = in_stack_fffffffffffffd28[0x27];
  nhdr_00.dim[0] = in_stack_fffffffffffffd28._40_2_;
  nhdr_00.dim[1] = in_stack_fffffffffffffd28._42_2_;
  nhdr_00.dim[2] = in_stack_fffffffffffffd28._44_2_;
  nhdr_00.dim[3] = in_stack_fffffffffffffd28._46_2_;
  nhdr_00.dim[4] = in_stack_fffffffffffffd28._48_2_;
  nhdr_00.dim[5] = in_stack_fffffffffffffd28._50_2_;
  nhdr_00.dim[6] = in_stack_fffffffffffffd28._52_2_;
  nhdr_00.dim[7] = in_stack_fffffffffffffd28._54_2_;
  nhdr_00.intent_p1 = (float)in_stack_fffffffffffffd28._56_4_;
  nhdr_00.intent_p2 = (float)in_stack_fffffffffffffd28._60_4_;
  nhdr_00.intent_p3 = (float)in_stack_fffffffffffffd28._64_4_;
  nhdr_00.intent_code = in_stack_fffffffffffffd28._68_2_;
  nhdr_00.datatype = in_stack_fffffffffffffd28._70_2_;
  nhdr_00.bitpix = in_stack_fffffffffffffd28._72_2_;
  nhdr_00.slice_start = in_stack_fffffffffffffd28._74_2_;
  nhdr_00.pixdim[0] = (float)in_stack_fffffffffffffd28._76_4_;
  nhdr_00.pixdim[1] = (float)in_stack_fffffffffffffd28._80_4_;
  nhdr_00.pixdim[2] = (float)in_stack_fffffffffffffd28._84_4_;
  nhdr_00.pixdim[3] = (float)in_stack_fffffffffffffd28._88_4_;
  nhdr_00.pixdim[4] = (float)in_stack_fffffffffffffd28._92_4_;
  nhdr_00.pixdim[5] = (float)in_stack_fffffffffffffd28._96_4_;
  nhdr_00.pixdim[6] = (float)in_stack_fffffffffffffd28._100_4_;
  nhdr_00.pixdim[7] = (float)in_stack_fffffffffffffd28._104_4_;
  nhdr_00.vox_offset = (float)in_stack_fffffffffffffd28._108_4_;
  nhdr_00.scl_slope = (float)in_stack_fffffffffffffd28._112_4_;
  nhdr_00.scl_inter = (float)in_stack_fffffffffffffd28._116_4_;
  nhdr_00.slice_end = in_stack_fffffffffffffd28._120_2_;
  nhdr_00.slice_code = in_stack_fffffffffffffd28[0x7a];
  nhdr_00.xyzt_units = in_stack_fffffffffffffd28[0x7b];
  nhdr_00.cal_max = (float)in_stack_fffffffffffffd28._124_4_;
  nhdr_00.cal_min = (float)in_stack_fffffffffffffd28._128_4_;
  nhdr_00.slice_duration = (float)in_stack_fffffffffffffd28._132_4_;
  nhdr_00.toffset = (float)in_stack_fffffffffffffd28._136_4_;
  nhdr_00.glmax = in_stack_fffffffffffffd28._140_4_;
  nhdr_00.glmin = in_stack_fffffffffffffd28._144_4_;
  nhdr_00.descrip[0] = in_stack_fffffffffffffd28[0x94];
  nhdr_00.descrip[1] = in_stack_fffffffffffffd28[0x95];
  nhdr_00.descrip[2] = in_stack_fffffffffffffd28[0x96];
  nhdr_00.descrip[3] = in_stack_fffffffffffffd28[0x97];
  nhdr_00.descrip[4] = in_stack_fffffffffffffd28[0x98];
  nhdr_00.descrip[5] = in_stack_fffffffffffffd28[0x99];
  nhdr_00.descrip[6] = in_stack_fffffffffffffd28[0x9a];
  nhdr_00.descrip[7] = in_stack_fffffffffffffd28[0x9b];
  nhdr_00.descrip[8] = in_stack_fffffffffffffd28[0x9c];
  nhdr_00.descrip[9] = in_stack_fffffffffffffd28[0x9d];
  nhdr_00.descrip[10] = in_stack_fffffffffffffd28[0x9e];
  nhdr_00.descrip[0xb] = in_stack_fffffffffffffd28[0x9f];
  nhdr_00.descrip[0xc] = in_stack_fffffffffffffd28[0xa0];
  nhdr_00.descrip[0xd] = in_stack_fffffffffffffd28[0xa1];
  nhdr_00.descrip[0xe] = in_stack_fffffffffffffd28[0xa2];
  nhdr_00.descrip[0xf] = in_stack_fffffffffffffd28[0xa3];
  nhdr_00.descrip[0x10] = in_stack_fffffffffffffd28[0xa4];
  nhdr_00.descrip[0x11] = in_stack_fffffffffffffd28[0xa5];
  nhdr_00.descrip[0x12] = in_stack_fffffffffffffd28[0xa6];
  nhdr_00.descrip[0x13] = in_stack_fffffffffffffd28[0xa7];
  nhdr_00.descrip[0x14] = in_stack_fffffffffffffd28[0xa8];
  nhdr_00.descrip[0x15] = in_stack_fffffffffffffd28[0xa9];
  nhdr_00.descrip[0x16] = in_stack_fffffffffffffd28[0xaa];
  nhdr_00.descrip[0x17] = in_stack_fffffffffffffd28[0xab];
  nhdr_00.descrip[0x18] = in_stack_fffffffffffffd28[0xac];
  nhdr_00.descrip[0x19] = in_stack_fffffffffffffd28[0xad];
  nhdr_00.descrip[0x1a] = in_stack_fffffffffffffd28[0xae];
  nhdr_00.descrip[0x1b] = in_stack_fffffffffffffd28[0xaf];
  nhdr_00.descrip[0x1c] = in_stack_fffffffffffffd28[0xb0];
  nhdr_00.descrip[0x1d] = in_stack_fffffffffffffd28[0xb1];
  nhdr_00.descrip[0x1e] = in_stack_fffffffffffffd28[0xb2];
  nhdr_00.descrip[0x1f] = in_stack_fffffffffffffd28[0xb3];
  nhdr_00.descrip[0x20] = in_stack_fffffffffffffd28[0xb4];
  nhdr_00.descrip[0x21] = in_stack_fffffffffffffd28[0xb5];
  nhdr_00.descrip[0x22] = in_stack_fffffffffffffd28[0xb6];
  nhdr_00.descrip[0x23] = in_stack_fffffffffffffd28[0xb7];
  nhdr_00.descrip[0x24] = in_stack_fffffffffffffd28[0xb8];
  nhdr_00.descrip[0x25] = in_stack_fffffffffffffd28[0xb9];
  nhdr_00.descrip[0x26] = in_stack_fffffffffffffd28[0xba];
  nhdr_00.descrip[0x27] = in_stack_fffffffffffffd28[0xbb];
  nhdr_00.descrip[0x28] = in_stack_fffffffffffffd28[0xbc];
  nhdr_00.descrip[0x29] = in_stack_fffffffffffffd28[0xbd];
  nhdr_00.descrip[0x2a] = in_stack_fffffffffffffd28[0xbe];
  nhdr_00.descrip[0x2b] = in_stack_fffffffffffffd28[0xbf];
  nhdr_00.descrip[0x2c] = in_stack_fffffffffffffd28[0xc0];
  nhdr_00.descrip[0x2d] = in_stack_fffffffffffffd28[0xc1];
  nhdr_00.descrip[0x2e] = in_stack_fffffffffffffd28[0xc2];
  nhdr_00.descrip[0x2f] = in_stack_fffffffffffffd28[0xc3];
  nhdr_00.descrip[0x30] = in_stack_fffffffffffffd28[0xc4];
  nhdr_00.descrip[0x31] = in_stack_fffffffffffffd28[0xc5];
  nhdr_00.descrip[0x32] = in_stack_fffffffffffffd28[0xc6];
  nhdr_00.descrip[0x33] = in_stack_fffffffffffffd28[199];
  nhdr_00.descrip[0x34] = in_stack_fffffffffffffd28[200];
  nhdr_00.descrip[0x35] = in_stack_fffffffffffffd28[0xc9];
  nhdr_00.descrip[0x36] = in_stack_fffffffffffffd28[0xca];
  nhdr_00.descrip[0x37] = in_stack_fffffffffffffd28[0xcb];
  nhdr_00.descrip[0x38] = in_stack_fffffffffffffd28[0xcc];
  nhdr_00.descrip[0x39] = in_stack_fffffffffffffd28[0xcd];
  nhdr_00.descrip[0x3a] = in_stack_fffffffffffffd28[0xce];
  nhdr_00.descrip[0x3b] = in_stack_fffffffffffffd28[0xcf];
  nhdr_00.descrip[0x3c] = in_stack_fffffffffffffd28[0xd0];
  nhdr_00.descrip[0x3d] = in_stack_fffffffffffffd28[0xd1];
  nhdr_00.descrip[0x3e] = in_stack_fffffffffffffd28[0xd2];
  nhdr_00.descrip[0x3f] = in_stack_fffffffffffffd28[0xd3];
  nhdr_00.descrip[0x40] = in_stack_fffffffffffffd28[0xd4];
  nhdr_00.descrip[0x41] = in_stack_fffffffffffffd28[0xd5];
  nhdr_00.descrip[0x42] = in_stack_fffffffffffffd28[0xd6];
  nhdr_00.descrip[0x43] = in_stack_fffffffffffffd28[0xd7];
  nhdr_00.descrip[0x44] = in_stack_fffffffffffffd28[0xd8];
  nhdr_00.descrip[0x45] = in_stack_fffffffffffffd28[0xd9];
  nhdr_00.descrip[0x46] = in_stack_fffffffffffffd28[0xda];
  nhdr_00.descrip[0x47] = in_stack_fffffffffffffd28[0xdb];
  nhdr_00.descrip[0x48] = in_stack_fffffffffffffd28[0xdc];
  nhdr_00.descrip[0x49] = in_stack_fffffffffffffd28[0xdd];
  nhdr_00.descrip[0x4a] = in_stack_fffffffffffffd28[0xde];
  nhdr_00.descrip[0x4b] = in_stack_fffffffffffffd28[0xdf];
  nhdr_00.descrip[0x4c] = in_stack_fffffffffffffd28[0xe0];
  nhdr_00.descrip[0x4d] = in_stack_fffffffffffffd28[0xe1];
  nhdr_00.descrip[0x4e] = in_stack_fffffffffffffd28[0xe2];
  nhdr_00.descrip[0x4f] = in_stack_fffffffffffffd28[0xe3];
  nhdr_00.aux_file[0] = in_stack_fffffffffffffd28[0xe4];
  nhdr_00.aux_file[1] = in_stack_fffffffffffffd28[0xe5];
  nhdr_00.aux_file[2] = in_stack_fffffffffffffd28[0xe6];
  nhdr_00.aux_file[3] = in_stack_fffffffffffffd28[0xe7];
  nhdr_00.aux_file[4] = in_stack_fffffffffffffd28[0xe8];
  nhdr_00.aux_file[5] = in_stack_fffffffffffffd28[0xe9];
  nhdr_00.aux_file[6] = in_stack_fffffffffffffd28[0xea];
  nhdr_00.aux_file[7] = in_stack_fffffffffffffd28[0xeb];
  nhdr_00.aux_file[8] = in_stack_fffffffffffffd28[0xec];
  nhdr_00.aux_file[9] = in_stack_fffffffffffffd28[0xed];
  nhdr_00.aux_file[10] = in_stack_fffffffffffffd28[0xee];
  nhdr_00.aux_file[0xb] = in_stack_fffffffffffffd28[0xef];
  nhdr_00.aux_file[0xc] = in_stack_fffffffffffffd28[0xf0];
  nhdr_00.aux_file[0xd] = in_stack_fffffffffffffd28[0xf1];
  nhdr_00.aux_file[0xe] = in_stack_fffffffffffffd28[0xf2];
  nhdr_00.aux_file[0xf] = in_stack_fffffffffffffd28[0xf3];
  nhdr_00.aux_file[0x10] = in_stack_fffffffffffffd28[0xf4];
  nhdr_00.aux_file[0x11] = in_stack_fffffffffffffd28[0xf5];
  nhdr_00.aux_file[0x12] = in_stack_fffffffffffffd28[0xf6];
  nhdr_00.aux_file[0x13] = in_stack_fffffffffffffd28[0xf7];
  nhdr_00.aux_file[0x14] = in_stack_fffffffffffffd28[0xf8];
  nhdr_00.aux_file[0x15] = in_stack_fffffffffffffd28[0xf9];
  nhdr_00.aux_file[0x16] = in_stack_fffffffffffffd28[0xfa];
  nhdr_00.aux_file[0x17] = in_stack_fffffffffffffd28[0xfb];
  nhdr_00.qform_code = in_stack_fffffffffffffd28._252_2_;
  nhdr_00.sform_code = in_stack_fffffffffffffd28._254_2_;
  nhdr_00.quatern_b = (float)in_stack_fffffffffffffd28._256_4_;
  nhdr_00.quatern_c = (float)in_stack_fffffffffffffd28._260_4_;
  nhdr_00.quatern_d = (float)in_stack_fffffffffffffd28._264_4_;
  nhdr_00.qoffset_x = (float)in_stack_fffffffffffffd28._268_4_;
  nhdr_00.qoffset_y = (float)in_stack_fffffffffffffd28._272_4_;
  nhdr_00.qoffset_z = (float)in_stack_fffffffffffffd28._276_4_;
  nhdr_00.srow_x[0] = (float)in_stack_fffffffffffffd28._280_4_;
  nhdr_00.srow_x[1] = (float)in_stack_fffffffffffffd28._284_4_;
  nhdr_00.srow_x[2] = (float)in_stack_fffffffffffffd28._288_4_;
  nhdr_00.srow_x[3] = (float)in_stack_fffffffffffffd28._292_4_;
  nhdr_00.srow_y[0] = (float)in_stack_fffffffffffffd28._296_4_;
  nhdr_00.srow_y[1] = (float)in_stack_fffffffffffffd28._300_4_;
  nhdr_00.srow_y[2] = (float)in_stack_fffffffffffffd28._304_4_;
  nhdr_00.srow_y[3] = (float)in_stack_fffffffffffffd28._308_4_;
  nhdr_00.srow_z[0] = (float)in_stack_fffffffffffffd28._312_4_;
  nhdr_00.srow_z[1] = (float)in_stack_fffffffffffffd28._316_4_;
  nhdr_00.srow_z[2] = (float)in_stack_fffffffffffffd28._320_4_;
  nhdr_00.srow_z[3] = (float)in_stack_fffffffffffffd28._324_4_;
  nhdr_00.intent_name[0] = in_stack_fffffffffffffd28[0x148];
  nhdr_00.intent_name[1] = in_stack_fffffffffffffd28[0x149];
  nhdr_00.intent_name[2] = in_stack_fffffffffffffd28[0x14a];
  nhdr_00.intent_name[3] = in_stack_fffffffffffffd28[0x14b];
  nhdr_00.intent_name[4] = in_stack_fffffffffffffd28[0x14c];
  nhdr_00.intent_name[5] = in_stack_fffffffffffffd28[0x14d];
  nhdr_00.intent_name[6] = in_stack_fffffffffffffd28[0x14e];
  nhdr_00.intent_name[7] = in_stack_fffffffffffffd28[0x14f];
  nhdr_00.intent_name[8] = in_stack_fffffffffffffd28[0x150];
  nhdr_00.intent_name[9] = in_stack_fffffffffffffd28[0x151];
  nhdr_00.intent_name[10] = in_stack_fffffffffffffd28[0x152];
  nhdr_00.intent_name[0xb] = in_stack_fffffffffffffd28[0x153];
  nhdr_00.intent_name[0xc] = in_stack_fffffffffffffd28[0x154];
  nhdr_00.intent_name[0xd] = in_stack_fffffffffffffd28[0x155];
  nhdr_00.intent_name[0xe] = in_stack_fffffffffffffd28[0x156];
  nhdr_00.intent_name[0xf] = in_stack_fffffffffffffd28[0x157];
  pnVar1 = nifti_convert_nhdr2nim(nhdr_00,(char *)0x0);
  pnVar1->fname = (char *)0x0;
  pnVar1->iname = (char *)0x0;
  return pnVar1;
}

Assistant:

nifti_image* nifti_simple_init_nim(void)
{
  nifti_image *nim;
  struct nifti_1_header nhdr;
  int nbyper, swapsize;

   memset(&nhdr,0,sizeof(nhdr)) ;  /* zero out header, to be safe */

   nhdr.sizeof_hdr = sizeof(nhdr) ;
   nhdr.regular    = 'r' ;           /* for some stupid reason */

   nhdr.dim[0] = 3 ;
   nhdr.dim[1] = 1 ; nhdr.dim[2] = 1 ; nhdr.dim[3] = 1 ;
   nhdr.dim[4] = 0 ;

   nhdr.pixdim[0] = 0.0f ;
   nhdr.pixdim[1] = 1.0f ; nhdr.pixdim[2] = 1.0f ;
   nhdr.pixdim[3] = 1.0f ;

   nhdr.datatype = DT_FLOAT32 ;
   nifti_datatype_sizes( nhdr.datatype , &nbyper, &swapsize );
   nhdr.bitpix   = 8 * nbyper ;

   strcpy(nhdr.magic, "n+1");  /* init to single file */

   nim = nifti_convert_nhdr2nim(nhdr,NULL);
   nim->fname = NULL;
   nim->iname = NULL;
   return nim;
}